

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegerField.cpp
# Opt level: O0

void __thiscall IntegerField::IntegerField(IntegerField *this,string *name,int size)

{
  IntegerElement *pIVar1;
  int local_50;
  int i;
  string local_40;
  int local_1c;
  string *psStack_18;
  int size_local;
  string *name_local;
  IntegerField *this_local;
  
  local_1c = size;
  psStack_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Tag::Tag(&this->super_Tag,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Tag).super_StreamObject._vptr_StreamObject = (_func_int **)&PTR_write_00111d00;
  if (local_1c == 0) {
    pIVar1 = (IntegerElement *)operator_new(0x48);
    IntegerElement::IntegerElement(pIVar1);
    Tag::addElement(&this->super_Tag,(StreamObject *)pIVar1);
  }
  else {
    for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
      pIVar1 = (IntegerElement *)operator_new(0x48);
      IntegerElement::IntegerElement(pIVar1);
      Tag::addElement(&this->super_Tag,(StreamObject *)pIVar1);
    }
  }
  (this->super_Tag)._lineSize = 1;
  (this->super_Tag)._numberOfLines = local_1c;
  return;
}

Assistant:

IntegerField::IntegerField( std::string name, int size ) : Tag( name )
{
	// we have to add at least one element
	if ( size == 0 )
	{
		addElement( new IntegerElement() );
	}
	else
	{
		for ( int i = 0; i < size; i++ )
		{
			addElement( new IntegerElement() );
		}
	}
	// We want to treat each element
	// as seperate line
	_lineSize = 1;
	_numberOfLines = size;
}